

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WDString.cpp
# Opt level: O2

void get_next(string *T,int *next)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  
  next[1] = 0;
  uVar1 = T->_M_string_length;
  iVar3 = 0;
  uVar4 = 1;
  while (uVar4 < uVar1) {
    if ((iVar3 == 0) || (pcVar2 = (T->_M_dataplus)._M_p, pcVar2[uVar4] == pcVar2[iVar3])) {
      iVar3 = iVar3 + 1;
      next[uVar4 + 1] = iVar3;
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    else {
      iVar3 = next[iVar3];
    }
  }
  printf("The next array is:");
  printArray(next,(int)T->_M_string_length);
  return;
}

Assistant:

void get_next(string T, int next[])
{
    int i = 1, j = 0;
    next[1] = 0;
    while(i < T.length())
    {
        if(j==0 || T[i]==T[j])
        {
            ++i; ++j;
            next[i] = j;
        }
        else j = next[j];
    }
    printf("The next array is:");
    printArray(next,T.length());
}